

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:505:35)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:505:35)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  Vec3f dy;
  Vec3f dx;
  Vec3f p0;
  undefined1 local_b0 [28];
  undefined1 local_94 [20];
  pointer local_80;
  pointer local_78;
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  _func_int **local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getVec3f((ParseStream *)local_94);
  ParseStream::getVec3f((ParseStream *)(local_b0 + 0x10));
  ParseStream::getVec3f((ParseStream *)local_b0);
  fVar3 = ParseStream::getFloat(this_00);
  fVar4 = ParseStream::getFloat(this_00);
  iVar2 = ParseStream::getInt(this_00);
  local_28 = ZEXT416((uint)local_94._0_4_);
  local_68 = local_94._4_8_;
  uStack_60 = 0;
  local_58 = ZEXT416((uint)local_b0._16_4_);
  _local_38 = local_b0._20_8_;
  uStack_30 = 0;
  local_48 = (_func_int **)local_b0._0_8_;
  uStack_40 = 0;
  local_80 = (pointer)0x0;
  local_94._12_8_ = operator_new(0x40);
  (((pointer)local_94._12_8_)->first)._M_dataplus._M_p = (pointer)pSVar1;
  *(undefined4 *)&(((pointer)local_94._12_8_)->first)._M_string_length = local_28._0_4_;
  *(undefined4 *)((long)&(((pointer)local_94._12_8_)->first)._M_string_length + 4) =
       (undefined4)local_68;
  *(undefined4 *)&(((pointer)local_94._12_8_)->first).field_2 = local_68._4_4_;
  *(undefined4 *)((long)&(((pointer)local_94._12_8_)->first).field_2 + 4) = local_58._0_4_;
  *(undefined4 *)((long)&(((pointer)local_94._12_8_)->first).field_2 + 8) = local_38;
  *(undefined4 *)((long)&(((pointer)local_94._12_8_)->first).field_2 + 0xc) = uStack_34;
  *(int *)&(((pointer)local_94._12_8_)->second).fileName.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr = (int)local_48;
  *(int *)((long)&(((pointer)local_94._12_8_)->second).fileName.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 4) = (int)((ulong)local_48 >> 0x20);
  *(undefined4 *)
   &(((pointer)local_94._12_8_)->second).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = local_b0._8_4_;
  *(float *)((long)&(((pointer)local_94._12_8_)->second).fileName.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 4) = fVar3;
  *(float *)&(((pointer)local_94._12_8_)->second).lineNumber = fVar4;
  (((pointer)local_94._12_8_)->second).colNumber = (long)iVar2;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:512:27)>
             ::_M_invoke;
  local_78 = (pointer)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:512:27)>
                      ::_M_manager;
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&pSVar1->futures
             ,(function<void_()> *)(local_94 + 0xc));
  if (local_78 != (pointer)0x0) {
    (*(code *)local_78)(local_94 + 0xc,local_94 + 0xc,3);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }